

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

void __thiscall spvtools::opt::InlinePass::AnalyzeReturns(InlinePass *this,Function *func)

{
  const_iterator cVar1;
  Function *this_00;
  bool bVar2;
  Op opcode;
  Instruction *this_01;
  BasicBlock *pBVar3;
  uint32_t local_6c;
  undefined1 local_68 [8];
  const_iterator terminal_ii;
  value_type *blk;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  uint32_t local_1c;
  Function *local_18;
  Function *func_local;
  InlinePass *this_local;
  
  local_18 = func;
  func_local = (Function *)this;
  bVar2 = HasNoReturnInLoop(this,func);
  if (bVar2) {
    local_1c = Function::result_id(local_18);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (&this->no_return_in_loop_,&local_1c);
  }
  this_00 = local_18;
  join_0x00000010_0x00000000_ = Function::begin(local_18);
  _blk = Function::end(this_00);
  while( true ) {
    bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&blk);
    if (!bVar2) {
      return;
    }
    terminal_ii.node_ =
         (Instruction *)
         UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                   ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
    BasicBlock::cend((BasicBlock *)local_68);
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator--
              ((iterator_template<const_spvtools::opt::Instruction> *)local_68);
    this_01 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<const_spvtools::opt::Instruction>::operator->
                        ((iterator_template<const_spvtools::opt::Instruction> *)local_68);
    opcode = Instruction::opcode(this_01);
    bVar2 = spvOpcodeIsReturn(opcode);
    cVar1 = terminal_ii;
    if ((bVar2) && (pBVar3 = Function::tail(local_18), (BasicBlock *)cVar1.node_ != pBVar3)) break;
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
  }
  local_6c = Function::result_id(local_18);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
            (&this->early_return_funcs_,&local_6c);
  return;
}

Assistant:

void InlinePass::AnalyzeReturns(Function* func) {
  // Analyze functions without a return in loop.
  if (HasNoReturnInLoop(func)) {
    no_return_in_loop_.insert(func->result_id());
  }
  // Analyze functions with a return before its tail basic block.
  for (auto& blk : *func) {
    auto terminal_ii = blk.cend();
    --terminal_ii;
    if (spvOpcodeIsReturn(terminal_ii->opcode()) && &blk != func->tail()) {
      early_return_funcs_.insert(func->result_id());
      break;
    }
  }
}